

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
          (basisu_lowlevel_etc1s_transcoder *this,uint32_t num_endpoints,uint8_t *pEndpoints_data,
          uint32_t endpoints_data_size,uint32_t num_selectors,uint8_t *pSelectors_data,
          uint32_t selectors_data_size)

{
  endpoint_vec *this_00;
  endpoint *peVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  uint8_t uVar8;
  byte bVar9;
  selector *this_01;
  ulong uVar10;
  byte bVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint uVar14;
  uint uVar15;
  uint32_t j;
  long lVar16;
  uint32_t k;
  uint32_t x;
  uint8_t prev_bytes [4];
  huffman_decoding_table inten_delta_model;
  huffman_decoding_table color5_delta_model2;
  huffman_decoding_table color5_delta_model1;
  huffman_decoding_table color5_delta_model0;
  huffman_decoding_table delta_selector_pal_model;
  bitwise_decoder local_170;
  byte local_144 [4];
  selector_vec *local_140;
  byte local_134 [4];
  ulong local_130;
  huffman_decoding_table local_128;
  huffman_decoding_table local_f8;
  huffman_decoding_table local_c8;
  huffman_decoding_table local_98;
  huffman_decoding_table local_68;
  
  if (this->m_pGlobal_codebook != (basisu_lowlevel_etc1s_transcoder *)0x0) {
    return false;
  }
  local_170.m_buf_size = 0;
  local_170.m_pBuf = (byte *)0x0;
  local_170.m_pBuf_start = (uint8_t *)0x0;
  local_170.m_pBuf_end = (byte *)0x0;
  local_170.m_bit_buf = 0;
  local_170.m_bit_buf_size = 0;
  local_98.m_tree.m_p = (short *)0x0;
  local_98.m_tree.m_size = 0;
  local_98.m_tree.m_capacity = 0;
  local_98.m_lookup.m_p = (int *)0x0;
  local_98.m_lookup.m_size = 0;
  local_98.m_lookup.m_capacity = 0;
  local_98.m_code_sizes.m_p = (uchar *)0x0;
  local_98.m_code_sizes.m_size = 0;
  local_98.m_code_sizes.m_capacity = 0;
  local_c8.m_tree.m_p = (short *)0x0;
  local_c8.m_tree.m_size = 0;
  local_c8.m_tree.m_capacity = 0;
  local_c8.m_lookup.m_p = (int *)0x0;
  local_c8.m_lookup.m_size = 0;
  local_c8.m_lookup.m_capacity = 0;
  local_c8.m_code_sizes.m_p = (uchar *)0x0;
  local_c8.m_code_sizes.m_size = 0;
  local_c8.m_code_sizes.m_capacity = 0;
  local_f8.m_tree.m_p = (short *)0x0;
  local_f8.m_tree.m_size = 0;
  local_f8.m_tree.m_capacity = 0;
  local_f8.m_lookup.m_p = (int *)0x0;
  local_f8.m_lookup.m_size = 0;
  local_f8.m_lookup.m_capacity = 0;
  local_f8.m_code_sizes.m_p = (uchar *)0x0;
  local_f8.m_code_sizes.m_size = 0;
  local_f8.m_code_sizes.m_capacity = 0;
  local_128.m_tree.m_p = (short *)0x0;
  local_128.m_tree.m_size = 0;
  local_128.m_tree.m_capacity = 0;
  local_128.m_lookup.m_p = (int *)0x0;
  local_128.m_lookup.m_size = 0;
  local_128.m_lookup.m_capacity = 0;
  local_128.m_code_sizes.m_p = (uchar *)0x0;
  local_128.m_code_sizes.m_size = 0;
  local_128.m_code_sizes.m_capacity = 0;
  if (pEndpoints_data != (uint8_t *)0x0 || endpoints_data_size == 0) {
    local_170.m_pBuf_end = pEndpoints_data + endpoints_data_size;
    local_170.m_bit_buf = 0;
    local_170.m_bit_buf_size = 0;
    local_170.m_buf_size = endpoints_data_size;
    local_170.m_pBuf = pEndpoints_data;
    local_170.m_pBuf_start = pEndpoints_data;
    bVar2 = bitwise_decoder::read_huffman_table(&local_170,&local_98);
    if (((((bVar2) && (bVar2 = bitwise_decoder::read_huffman_table(&local_170,&local_c8), bVar2)) &&
         (bVar2 = bitwise_decoder::read_huffman_table(&local_170,&local_f8), bVar2)) &&
        ((bVar2 = bitwise_decoder::read_huffman_table(&local_170,&local_128), bVar2 &&
         (local_98.m_code_sizes.m_size != 0)))) &&
       ((local_c8.m_code_sizes.m_size != 0 &&
        ((local_f8.m_code_sizes.m_size != 0 && (local_128.m_code_sizes.m_size != 0)))))) {
      uVar3 = bitwise_decoder::get_bits(&local_170,1);
      this_00 = &this->m_local_endpoints;
      basisu::vector<basist::endpoint>::resize(this_00,(ulong)num_endpoints,false);
      local_134[0] = 0x10;
      local_134[1] = 0x10;
      local_134[2] = 0x10;
      local_134[3] = 0;
      if (num_endpoints != 0) {
        uVar5 = 0;
        uVar8 = '\0';
        do {
          if (local_128.m_code_sizes.m_size == 0) {
LAB_0011f509:
            __assert_fail("ct.m_code_sizes.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                          ,0x1bf,
                          "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
                         );
          }
          pbVar12 = local_170.m_pBuf;
          if (local_170.m_bit_buf_size < 0x10) {
            do {
              uVar15 = 0;
              pbVar13 = pbVar12;
              if (pbVar12 < local_170.m_pBuf_end) {
                pbVar13 = pbVar12 + 1;
                uVar15 = (uint)*pbVar12;
                local_170.m_pBuf = pbVar13;
              }
              local_170.m_bit_buf =
                   local_170.m_bit_buf | uVar15 << ((byte)local_170.m_bit_buf_size & 0x1f);
              uVar15 = local_170.m_bit_buf_size + 8;
              bVar2 = local_170.m_bit_buf_size < 8;
              pbVar12 = pbVar13;
              local_170.m_bit_buf_size = uVar15;
            } while (bVar2);
          }
          if (local_128.m_lookup.m_size <= (local_170.m_bit_buf & 0x3ff)) {
LAB_0011f4f2:
            pcVar7 = "const T &basisu::vector<int>::operator[](size_t) const [T = int]";
            goto LAB_0011f4b2;
          }
          uVar15 = local_128.m_lookup.m_p[local_170.m_bit_buf & 0x3ff];
          if ((int)uVar15 < 0) {
            uVar6 = 10;
            do {
              uVar14 = ~uVar15 + (uint)((local_170.m_bit_buf >> (uVar6 & 0x1f) & 1) != 0);
              if (local_128.m_tree.m_size <= uVar14) goto LAB_0011f49d;
              uVar6 = uVar6 + 1;
              uVar15 = (uint)local_128.m_tree.m_p[uVar14];
            } while (local_128.m_tree.m_p[uVar14] < 0);
          }
          else {
            uVar6 = uVar15 >> 0x10;
          }
          local_170.m_bit_buf = local_170.m_bit_buf >> ((byte)uVar6 & 0x1f);
          local_170.m_bit_buf_size = local_170.m_bit_buf_size - uVar6;
          if (((this->m_local_endpoints).m_size <= uVar5) ||
             ((this->m_local_endpoints).m_p[uVar5].m_inten5 = (char)uVar15 + uVar8 & 7,
             (this->m_local_endpoints).m_size <= uVar5)) {
LAB_0011f4d3:
            pcVar7 = 
            "T &basisu::vector<basist::endpoint>::operator[](size_t) [T = basist::endpoint]";
            goto LAB_0011f4e8;
          }
          uVar8 = this_00->m_p[uVar5].m_inten5;
          uVar10 = 0;
          do {
            bVar11 = local_134[uVar10];
            if (bVar11 < 10) {
              if (local_98.m_code_sizes.m_size == 0) goto LAB_0011f509;
              pbVar12 = local_170.m_pBuf;
              if (local_170.m_bit_buf_size < 0x10) {
                do {
                  uVar15 = 0;
                  pbVar13 = pbVar12;
                  if (pbVar12 < local_170.m_pBuf_end) {
                    pbVar13 = pbVar12 + 1;
                    uVar15 = (uint)*pbVar12;
                    local_170.m_pBuf = pbVar13;
                  }
                  local_170.m_bit_buf =
                       local_170.m_bit_buf | uVar15 << ((byte)local_170.m_bit_buf_size & 0x1f);
                  uVar15 = local_170.m_bit_buf_size + 8;
                  bVar2 = local_170.m_bit_buf_size < 8;
                  pbVar12 = pbVar13;
                  local_170.m_bit_buf_size = uVar15;
                } while (bVar2);
              }
              if (local_98.m_lookup.m_size <= (local_170.m_bit_buf & 0x3ff)) goto LAB_0011f4f2;
              uVar15 = local_98.m_lookup.m_p[local_170.m_bit_buf & 0x3ff];
              if (-1 < (int)uVar15) goto LAB_0011f00f;
              uVar6 = 10;
              do {
                uVar14 = ~uVar15 + (uint)((local_170.m_bit_buf >> (uVar6 & 0x1f) & 1) != 0);
                if (local_98.m_tree.m_size <= uVar14) goto LAB_0011f49d;
                uVar6 = uVar6 + 1;
                uVar15 = (uint)local_98.m_tree.m_p[uVar14];
              } while (local_98.m_tree.m_p[uVar14] < 0);
            }
            else if (bVar11 < 0x16) {
              if (local_c8.m_code_sizes.m_size == 0) goto LAB_0011f509;
              pbVar12 = local_170.m_pBuf;
              if (local_170.m_bit_buf_size < 0x10) {
                do {
                  uVar15 = 0;
                  pbVar13 = pbVar12;
                  if (pbVar12 < local_170.m_pBuf_end) {
                    pbVar13 = pbVar12 + 1;
                    uVar15 = (uint)*pbVar12;
                    local_170.m_pBuf = pbVar13;
                  }
                  local_170.m_bit_buf =
                       local_170.m_bit_buf | uVar15 << ((byte)local_170.m_bit_buf_size & 0x1f);
                  uVar15 = local_170.m_bit_buf_size + 8;
                  bVar2 = local_170.m_bit_buf_size < 8;
                  pbVar12 = pbVar13;
                  local_170.m_bit_buf_size = uVar15;
                } while (bVar2);
              }
              if (local_c8.m_lookup.m_size <= (local_170.m_bit_buf & 0x3ff)) goto LAB_0011f4f2;
              uVar15 = local_c8.m_lookup.m_p[local_170.m_bit_buf & 0x3ff];
              if ((int)uVar15 < 0) {
                uVar6 = 10;
                do {
                  uVar14 = ~uVar15 + (uint)((local_170.m_bit_buf >> (uVar6 & 0x1f) & 1) != 0);
                  if (local_c8.m_tree.m_size <= uVar14) goto LAB_0011f49d;
                  uVar6 = uVar6 + 1;
                  uVar15 = (uint)local_c8.m_tree.m_p[uVar14];
                } while (local_c8.m_tree.m_p[uVar14] < 0);
              }
              else {
LAB_0011f00f:
                uVar6 = uVar15 >> 0x10;
              }
            }
            else {
              if (local_f8.m_code_sizes.m_size == 0) goto LAB_0011f509;
              pbVar12 = local_170.m_pBuf;
              if (local_170.m_bit_buf_size < 0x10) {
                do {
                  uVar15 = 0;
                  pbVar13 = pbVar12;
                  if (pbVar12 < local_170.m_pBuf_end) {
                    pbVar13 = pbVar12 + 1;
                    uVar15 = (uint)*pbVar12;
                    local_170.m_pBuf = pbVar13;
                  }
                  local_170.m_bit_buf =
                       local_170.m_bit_buf | uVar15 << ((byte)local_170.m_bit_buf_size & 0x1f);
                  uVar15 = local_170.m_bit_buf_size + 8;
                  bVar2 = local_170.m_bit_buf_size < 8;
                  pbVar12 = pbVar13;
                  local_170.m_bit_buf_size = uVar15;
                } while (bVar2);
              }
              if (local_f8.m_lookup.m_size <= (local_170.m_bit_buf & 0x3ff)) goto LAB_0011f4f2;
              uVar15 = local_f8.m_lookup.m_p[local_170.m_bit_buf & 0x3ff];
              if (-1 < (int)uVar15) goto LAB_0011f00f;
              uVar6 = 10;
              do {
                uVar14 = ~uVar15 + (uint)((local_170.m_bit_buf >> (uVar6 & 0x1f) & 1) != 0);
                if (local_f8.m_tree.m_size <= uVar14) goto LAB_0011f49d;
                uVar6 = uVar6 + 1;
                uVar15 = (uint)local_f8.m_tree.m_p[uVar14];
              } while (local_f8.m_tree.m_p[uVar14] < 0);
            }
            local_170.m_bit_buf = local_170.m_bit_buf >> ((byte)uVar6 & 0x1f);
            local_170.m_bit_buf_size = local_170.m_bit_buf_size - uVar6;
            if ((this->m_local_endpoints).m_size <= uVar5) goto LAB_0011f4d3;
            bVar11 = bVar11 + (char)uVar15 & 0x1f;
            this_00->m_p[uVar5].m_color5.field_0.c[uVar10] = bVar11;
            local_134[uVar10] = bVar11;
          } while ((uVar3 == 0) && (bVar2 = uVar10 < 2, uVar10 = uVar10 + 1, bVar2));
          if (uVar3 != 0) {
            if (((this->m_local_endpoints).m_size <= uVar5) ||
               (peVar1 = (this->m_local_endpoints).m_p,
               peVar1[uVar5].m_color5.field_0.field_0.g = peVar1[uVar5].m_color5.field_0.field_0.r,
               (this->m_local_endpoints).m_size <= uVar5)) goto LAB_0011f4d3;
            this_00->m_p[uVar5].m_color5.field_0.field_0.b =
                 this_00->m_p[uVar5].m_color5.field_0.field_0.r;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != num_endpoints);
      }
      local_140 = &this->m_local_selectors;
      local_130 = (ulong)num_selectors;
      basisu::vector<basist::selector>::resize(local_140,(ulong)num_selectors,false);
      if (pSelectors_data != (uint8_t *)0x0 || selectors_data_size == 0) {
        local_170.m_buf_size = selectors_data_size;
        local_170.m_pBuf_end = pSelectors_data + selectors_data_size;
        local_170.m_bit_buf = 0;
        local_170.m_bit_buf_size = 0;
        local_68.m_tree.m_p = (short *)0x0;
        local_68.m_tree.m_size = 0;
        local_68.m_tree.m_capacity = 0;
        local_68.m_lookup.m_p = (int *)0x0;
        local_68.m_lookup.m_size = 0;
        local_68.m_lookup.m_capacity = 0;
        local_68.m_code_sizes.m_p = (uchar *)0x0;
        local_68.m_code_sizes.m_size = 0;
        local_68.m_code_sizes.m_capacity = 0;
        local_170.m_pBuf = pSelectors_data;
        local_170.m_pBuf_start = pSelectors_data;
        uVar3 = bitwise_decoder::get_bits(&local_170,1);
        if ((uVar3 == 1) || (uVar3 = bitwise_decoder::get_bits(&local_170,1), uVar3 == 1)) {
LAB_0011f180:
          bVar2 = false;
        }
        else {
          uVar3 = bitwise_decoder::get_bits(&local_170,1);
          if (uVar3 == 1) {
            if (num_selectors != 0) {
              uVar5 = 0;
              do {
                uVar3 = 0;
                do {
                  uVar4 = bitwise_decoder::get_bits(&local_170,8);
                  bVar11 = 0;
                  x = 0;
                  do {
                    if ((this->m_local_selectors).m_size <= uVar5) goto LAB_0011f4bc;
                    selector::set_selector
                              (local_140->m_p + uVar5,x,uVar3,uVar4 >> (bVar11 & 0x1f) & 3);
                    x = x + 1;
                    bVar11 = bVar11 + 2;
                  } while (x != 4);
                  uVar3 = uVar3 + 1;
                } while (uVar3 != 4);
                if ((this->m_local_selectors).m_size <= uVar5) {
LAB_0011f4bc:
                  pcVar7 = 
                  "T &basisu::vector<basist::selector>::operator[](size_t) [T = basist::selector]";
LAB_0011f4e8:
                  __assert_fail("i < m_size",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                                ,0x178,pcVar7);
                }
                selector::init_flags(local_140->m_p + uVar5);
                uVar5 = uVar5 + 1;
              } while (uVar5 != local_130);
            }
          }
          else {
            bVar2 = bitwise_decoder::read_huffman_table(&local_170,&local_68);
            if ((!bVar2) || ((1 < num_selectors && (local_68.m_code_sizes.m_size == 0))))
            goto LAB_0011f180;
            local_144[0] = 0;
            local_144[1] = 0;
            local_144[2] = 0;
            local_144[3] = 0;
            if (num_selectors != 0) {
              uVar5 = 0;
              do {
                if (uVar5 == 0) {
                  lVar16 = 0;
                  do {
                    uVar3 = bitwise_decoder::get_bits(&local_170,8);
                    local_144[lVar16] = (byte)uVar3;
                    bVar11 = 0;
                    uVar4 = 0;
                    do {
                      if ((this->m_local_selectors).m_size == 0) goto LAB_0011f4bc;
                      selector::set_selector
                                (local_140->m_p,uVar4,(uint32_t)lVar16,uVar3 >> (bVar11 & 0x1f) & 3)
                      ;
                      uVar4 = uVar4 + 1;
                      bVar11 = bVar11 + 2;
                    } while (uVar4 != 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  if ((this->m_local_selectors).m_size == 0) goto LAB_0011f4bc;
                  this_01 = local_140->m_p;
                }
                else {
                  lVar16 = 0;
                  do {
                    uVar3 = bitwise_decoder::decode_huffman(&local_170,&local_68,10);
                    bVar11 = local_144[lVar16];
                    local_144[lVar16] = (byte)(uVar3 ^ bVar11);
                    bVar9 = 0;
                    uVar4 = 0;
                    do {
                      if ((this->m_local_selectors).m_size <= uVar5) goto LAB_0011f4bc;
                      selector::set_selector
                                (local_140->m_p + uVar5,uVar4,(uint32_t)lVar16,
                                 (uVar3 ^ bVar11) >> (bVar9 & 0x1f) & 3);
                      uVar4 = uVar4 + 1;
                      bVar9 = bVar9 + 2;
                    } while (uVar4 != 4);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  if ((this->m_local_selectors).m_size <= uVar5) goto LAB_0011f4bc;
                  this_01 = local_140->m_p + uVar5;
                }
                selector::init_flags(this_01);
                uVar5 = uVar5 + 1;
              } while (uVar5 != local_130);
            }
          }
          bVar2 = true;
        }
        huffman_decoding_table::~huffman_decoding_table(&local_68);
        goto LAB_0011f193;
      }
    }
  }
  bVar2 = false;
LAB_0011f193:
  if (local_128.m_tree.m_p != (short *)0x0) {
    free(local_128.m_tree.m_p);
  }
  if (local_128.m_lookup.m_p != (int *)0x0) {
    free(local_128.m_lookup.m_p);
  }
  if (local_128.m_code_sizes.m_p != (uchar *)0x0) {
    free(local_128.m_code_sizes.m_p);
  }
  if (local_f8.m_tree.m_p != (short *)0x0) {
    free(local_f8.m_tree.m_p);
  }
  if (local_f8.m_lookup.m_p != (int *)0x0) {
    free(local_f8.m_lookup.m_p);
  }
  if (local_f8.m_code_sizes.m_p != (uchar *)0x0) {
    free(local_f8.m_code_sizes.m_p);
  }
  if (local_c8.m_tree.m_p != (short *)0x0) {
    free(local_c8.m_tree.m_p);
  }
  if (local_c8.m_lookup.m_p != (int *)0x0) {
    free(local_c8.m_lookup.m_p);
  }
  if (local_c8.m_code_sizes.m_p != (uchar *)0x0) {
    free(local_c8.m_code_sizes.m_p);
  }
  if (local_98.m_tree.m_p != (short *)0x0) {
    free(local_98.m_tree.m_p);
  }
  if (local_98.m_lookup.m_p != (int *)0x0) {
    free(local_98.m_lookup.m_p);
  }
  if (local_98.m_code_sizes.m_p != (uchar *)0x0) {
    free(local_98.m_code_sizes.m_p);
  }
  return bVar2;
LAB_0011f49d:
  pcVar7 = "const T &basisu::vector<short>::operator[](size_t) const [T = short]";
LAB_0011f4b2:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x177,pcVar7);
}

Assistant:

bool basisu_lowlevel_etc1s_transcoder::decode_palettes(
		uint32_t num_endpoints, const uint8_t* pEndpoints_data, uint32_t endpoints_data_size,
		uint32_t num_selectors, const uint8_t* pSelectors_data, uint32_t selectors_data_size)
	{
		if (m_pGlobal_codebook)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 11\n");
			return false;
		}
		bitwise_decoder sym_codec;

		huffman_decoding_table color5_delta_model0, color5_delta_model1, color5_delta_model2, inten_delta_model;

		if (!sym_codec.init(pEndpoints_data, endpoints_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 0\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model0))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model1))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model2))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(inten_delta_model))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		if (!color5_delta_model0.is_valid() || !color5_delta_model1.is_valid() || !color5_delta_model2.is_valid() || !inten_delta_model.is_valid())
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		const bool endpoints_are_grayscale = sym_codec.get_bits(1) != 0;

		m_local_endpoints.resize(num_endpoints);

		color32 prev_color5(16, 16, 16, 0);
		uint32_t prev_inten = 0;

		for (uint32_t i = 0; i < num_endpoints; i++)
		{
			uint32_t inten_delta = sym_codec.decode_huffman(inten_delta_model);
			m_local_endpoints[i].m_inten5 = static_cast<uint8_t>((inten_delta + prev_inten) & 7);
			prev_inten = m_local_endpoints[i].m_inten5;

			for (uint32_t c = 0; c < (endpoints_are_grayscale ? 1U : 3U); c++)
			{
				int delta;
				if (prev_color5[c] <= basist::COLOR5_PAL0_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model0);
				else if (prev_color5[c] <= basist::COLOR5_PAL1_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model1);
				else
					delta = sym_codec.decode_huffman(color5_delta_model2);

				int v = (prev_color5[c] + delta) & 31;

				m_local_endpoints[i].m_color5[c] = static_cast<uint8_t>(v);

				prev_color5[c] = static_cast<uint8_t>(v);
			}

			if (endpoints_are_grayscale)
			{
				m_local_endpoints[i].m_color5[1] = m_local_endpoints[i].m_color5[0];
				m_local_endpoints[i].m_color5[2] = m_local_endpoints[i].m_color5[0];
			}
		}

		sym_codec.stop();

		m_local_selectors.resize(num_selectors);
		
		if (!sym_codec.init(pSelectors_data, selectors_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 5\n");
			return false;
		}

		basist::huffman_decoding_table delta_selector_pal_model;

		const bool used_global_selector_cb = (sym_codec.get_bits(1) == 1);

		if (used_global_selector_cb)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: global selector codebooks are unsupported\n");
			return false;
		}
		else
		{
			const bool used_hybrid_selector_cb = (sym_codec.get_bits(1) == 1);

			if (used_hybrid_selector_cb)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: hybrid global selector codebooks are unsupported\n");
				return false;
			}
				
			const bool used_raw_encoding = (sym_codec.get_bits(1) == 1);

			if (used_raw_encoding)
			{
				for (uint32_t i = 0; i < num_selectors; i++)
				{
					for (uint32_t j = 0; j < 4; j++)
					{
						uint32_t cur_byte = sym_codec.get_bits(8);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}

					m_local_selectors[i].init_flags();
				}
			}
			else
			{
				if (!sym_codec.read_huffman_table(delta_selector_pal_model))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10\n");
					return false;
				}

				if ((num_selectors > 1) && (!delta_selector_pal_model.is_valid()))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10a\n");
					return false;
				}

				uint8_t prev_bytes[4] = { 0, 0, 0, 0 };

				for (uint32_t i = 0; i < num_selectors; i++)
				{
					if (!i)
					{
						for (uint32_t j = 0; j < 4; j++)
						{
							uint32_t cur_byte = sym_codec.get_bits(8);
							prev_bytes[j] = static_cast<uint8_t>(cur_byte);

							for (uint32_t k = 0; k < 4; k++)
								m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
						}
						m_local_selectors[i].init_flags();
						continue;
					}

					for (uint32_t j = 0; j < 4; j++)
					{
						int delta_byte = sym_codec.decode_huffman(delta_selector_pal_model);

						uint32_t cur_byte = delta_byte ^ prev_bytes[j];
						prev_bytes[j] = static_cast<uint8_t>(cur_byte);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}
					m_local_selectors[i].init_flags();
				}
			}
		}

		sym_codec.stop();

		return true;
	}